

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O3

CTypeID crec_bit64_type(CTState *cts,cTValue *tv)

{
  CType *pCVar1;
  uint uVar2;
  CTypeID CVar3;
  ulong uVar4;
  
  CVar3 = 0;
  if ((tv->field_2).it == 0xfffffff5) {
    pCVar1 = lj_ctype_rawref(cts,(uint)*(ushort *)((ulong)(tv->u32).lo + 6));
    uVar2 = pCVar1->info;
    if ((uVar2 & 0xf0000000) == 0x50000000) {
      uVar4 = (ulong)((uVar2 & 0xffff) << 4);
      pCVar1 = (CType *)((long)&cts->tab->info + uVar4);
      uVar2 = *(uint *)((long)&cts->tab->info + uVar4);
    }
    if (((uVar2 & 0xfc800000) != 0x800000) || (CVar3 = 0xc, pCVar1->size != 8)) {
      CVar3 = 0xb;
    }
  }
  return CVar3;
}

Assistant:

static CTypeID crec_bit64_type(CTState *cts, cTValue *tv)
{
  if (tviscdata(tv)) {
    CType *ct = lj_ctype_rawref(cts, cdataV(tv)->ctypeid);
    if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
    if ((ct->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && ct->size == 8)
      return CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    return CTID_INT64;  /* Otherwise use int64_t. */
  }
  return 0;  /* Use regular 32 bit ops. */
}